

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmopl.c
# Opt level: O1

FM_OPL * OPLCreate(UINT32 clock,UINT32 rate,int type)

{
  bool bVar1;
  ulong uVar2;
  FM_OPL *OPL;
  byte bVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  size_t __size;
  long lVar8;
  int *piVar9;
  long lVar10;
  FM_OPL *opl;
  double dVar11;
  double dVar12;
  
  iVar4 = num_lock + 1;
  bVar1 = num_lock < 1;
  num_lock = iVar4;
  if ((bVar1) && (tablesInit == '\0')) {
    tablesInit = '\x01';
    piVar9 = tl_tab;
    lVar10 = 0;
    do {
      lVar8 = lVar10 + 1;
      dVar11 = exp2((double)(int)lVar8 * 0.03125 * 0.125);
      dVar11 = floor(65536.0 / dVar11);
      iVar4 = ((int)dVar11 >> 5) + (uint)(((uint)(int)dVar11 >> 4 & 1) != 0);
      tl_tab[lVar10 * 2] = iVar4 * 2;
      tl_tab[lVar10 * 2 + 1] = iVar4 * -2;
      lVar7 = 0x804;
      bVar3 = 1;
      do {
        iVar4 = tl_tab[lVar10 * 2] >> (bVar3 & 0x1f);
        *(int *)((long)piVar9 + lVar7 + -4) = iVar4;
        *(int *)((long)piVar9 + lVar7) = -iVar4;
        lVar7 = lVar7 + 0x800;
        bVar3 = bVar3 + 1;
      } while (lVar7 != 0x6004);
      piVar9 = piVar9 + 2;
      lVar10 = lVar8;
    } while (lVar8 != 0x100);
    iVar4 = 1;
    lVar10 = 0;
    do {
      dVar11 = sin((double)iVar4 * 3.141592653589793 * 0.0009765625);
      dVar12 = log(*(double *)(&DAT_001786e0 + (ulong)(0.0 < dVar11) * 8) / dVar11);
      dVar12 = ((dVar12 * 8.0) / 0.6931471805599453) * 32.0;
      *(uint *)((long)sin_tab + lVar10) =
           (uint)(dVar11 < 0.0) | (int)(dVar12 + dVar12) + 1U & 0xfffffffe;
      lVar10 = lVar10 + 4;
      iVar4 = iVar4 + 2;
    } while (lVar10 != 0x1000);
    uVar2 = 0;
    do {
      uVar5 = 0x1800;
      uVar6 = 0x1800;
      if (uVar2 < 0x200) {
        uVar6 = sin_tab[uVar2];
      }
      sin_tab[uVar2 + 0x400] = uVar6;
      sin_tab[uVar2 + 0x800] = sin_tab[(uint)uVar2 & 0x1ff];
      if (((uint)uVar2 >> 8 & 1) == 0) {
        uVar5 = sin_tab[uVar2 & 0xff];
      }
      sin_tab[uVar2 + 0xc00] = uVar5;
      uVar2 = uVar2 + 1;
    } while (uVar2 != 0x400);
  }
  __size = 0x1878;
  if ((type & 2U) == 0) {
    __size = 0x17d8;
  }
  OPL = (FM_OPL *)calloc(1,__size);
  if (OPL == (FM_OPL *)0x0) {
    OPL = (FM_OPL *)0x0;
  }
  else {
    if ((type & 2U) != 0) {
      OPL->deltat = (YM_DELTAT *)(OPL + 1);
    }
    OPL->type = (UINT8)type;
    OPL_clock_changed(OPL,clock,rate);
    lVar10 = 0xdd;
    do {
      *(undefined1 *)((long)OPL->P_CH[0].SLOT[0].op1_out + lVar10 + -0x48) = 0;
      lVar10 = lVar10 + 0xc0;
    } while (lVar10 != 0x79d);
    OPL->MuteSpc[4] = '\0';
    OPL->MuteSpc[5] = '\0';
    OPL->MuteSpc[0] = '\0';
    OPL->MuteSpc[1] = '\0';
    OPL->MuteSpc[2] = '\0';
    OPL->MuteSpc[3] = '\0';
  }
  return OPL;
}

Assistant:

static FM_OPL *OPLCreate(UINT32 clock, UINT32 rate, int type)
{
	char *ptr;
	FM_OPL *OPL;
	int state_size;

	if (OPL_LockTable() == -1) return NULL;

	/* calculate OPL state size */
	state_size  = sizeof(FM_OPL);

#if BUILD_Y8950
	if (type&OPL_TYPE_ADPCM) state_size+= sizeof(YM_DELTAT);
#endif

	/* allocate memory block */
	ptr = (char *)calloc(1, state_size);
	if (ptr==NULL)
		return NULL;

	OPL  = (FM_OPL *)ptr;

	ptr += sizeof(FM_OPL);

#if BUILD_Y8950
	if (type&OPL_TYPE_ADPCM)
	{
		OPL->deltat = (YM_DELTAT *)ptr;
		ptr += sizeof(YM_DELTAT);
	}
#endif

	OPL->type  = type;
	OPL_clock_changed(OPL, clock, rate);

	opl_set_mute_mask(OPL, 0x0000);

	return OPL;
}